

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDFace::GetCornerEdges
          (ON_SubDFace *this,ON_SubDVertex *corner_vertex,ON_SubDEdgePtr *entering_edge,
          ON_SubDEdgePtr *leaving_edge)

{
  ushort uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ON_SubDEdgePtr *pOVar5;
  
  uVar1 = this->m_edge_count;
  if ((corner_vertex != (ON_SubDVertex *)0x0 && 2 < uVar1) &&
     (uVar4 = VertexIndex(this,corner_vertex), uVar4 < uVar1)) {
    uVar3 = ((uVar1 + uVar4) - 1) % (uint)uVar1;
    pOVar5 = this->m_edgex + -4;
    if (uVar3 < 4) {
      pOVar5 = this->m_edge4;
    }
    entering_edge->m_ptr = *(ON__UINT_PTR *)((long)&pOVar5->m_ptr + (ulong)(uVar3 * 8));
    pOVar5 = this->m_edgex + ((ulong)uVar4 - 4);
    if (uVar4 < 4) {
      pOVar5 = this->m_edge4 + uVar4;
    }
    uVar2 = pOVar5->m_ptr;
    leaving_edge->m_ptr = uVar2;
    return (uint)(7 < uVar2 && 7 < entering_edge->m_ptr);
  }
  entering_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
  leaving_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
  return 0xffffffff;
}

Assistant:

unsigned int  ON_SubDFace::GetCornerEdges(
  const ON_SubDVertex* corner_vertex,
  ON_SubDEdgePtr& entering_edge,
  ON_SubDEdgePtr& leaving_edge
) const
{
  for (;;)
  {
    const unsigned edge_count = this->EdgeCount();
    if (edge_count < 3)
      break;
    if (nullptr == corner_vertex)
      break;
    const unsigned fvi = this->VertexIndex(corner_vertex);
    if (fvi >= edge_count)
      break;
    entering_edge = this->EdgePtr((fvi + edge_count - 1) % edge_count);
    leaving_edge = this->EdgePtr(fvi);
    return entering_edge.IsNotNull() && leaving_edge.IsNotNull();
  }
  entering_edge = ON_SubDEdgePtr::Null;
  leaving_edge = ON_SubDEdgePtr::Null;
  return ON_UNSET_UINT_INDEX;
}